

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O2

int Ndr_ObjReadRange(Ndr_Data_t *p,int Obj,int *End,int *Beg)

{
  int iVar1;
  int *in_RAX;
  int *pArray;
  
  pArray = in_RAX;
  iVar1 = Ndr_ObjReadArray(p,Obj,8,&pArray);
  *Beg = 0;
  *End = 0;
  if (iVar1 != 0) {
    if (iVar1 == 3) {
      iVar1 = 1;
    }
    else {
      if (iVar1 == 1) {
        iVar1 = *pArray;
        *Beg = iVar1;
        *End = iVar1;
        return 0;
      }
      iVar1 = 0;
    }
    *End = *pArray;
    *Beg = pArray[1];
  }
  return iVar1;
}

Assistant:

int Ndr_ObjReadRange( Ndr_Data_t * p, int Obj, int * End, int * Beg )
{
    int * pArray, nArray = Ndr_ObjReadArray( p, Obj, NDR_RANGE, &pArray );
    int Signed = 0; *End = *Beg = 0;
    if ( nArray == 0 )
        return 0;
    if ( nArray == 3 )
        Signed = 1;
    if ( nArray == 1 )
        *End = *Beg = pArray[0];
    else
        *End = pArray[0], *Beg = pArray[1];
    return Signed;
}